

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum.cpp
# Opt level: O3

bool __thiscall OpenCLEnum::queryDeviceInfo(OpenCLEnum *this,Device *device)

{
  OpenCLEnum *pOVar1;
  pointer pPVar2;
  cl_device_id device_id;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  const_iterator cVar4;
  OpenCLEnum *pOVar5;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extensions;
  undefined1 local_80 [16];
  undefined1 local_70 [32];
  key_type local_50;
  
  device_id = device->id;
  pOVar1 = (OpenCLEnum *)(local_80 + 0x10);
  local_80._0_8_ = pOVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"CL_DEVICE_TYPE","");
  queryDeviceInfo<unsigned_long>(this,device_id,0x1000,&device->device_type,(string *)local_80);
  if ((OpenCLEnum *)local_80._0_8_ != pOVar1) {
    operator_delete((void *)local_80._0_8_);
  }
  pOVar5 = (OpenCLEnum *)local_80;
  local_80._0_8_ = pOVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)pOVar5,"CL_DEVICE_NAME","");
  queryDeviceInfo(pOVar5,device_id,0x102b,&device->name,(string *)local_80,0x400);
  if ((OpenCLEnum *)local_80._0_8_ != pOVar1) {
    operator_delete((void *)local_80._0_8_);
  }
  pOVar5 = (OpenCLEnum *)local_80;
  local_80._0_8_ = pOVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)pOVar5,"CL_DEVICE_VENDOR","");
  queryDeviceInfo(pOVar5,device_id,0x102c,&device->vendor,(string *)local_80,0x400);
  if ((OpenCLEnum *)local_80._0_8_ != pOVar1) {
    operator_delete((void *)local_80._0_8_);
  }
  local_80._0_8_ = pOVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"CL_DEVICE_VENDOR_ID","");
  queryDeviceInfo<unsigned_int>(this,device_id,0x1001,&device->vendor_id,(string *)local_80);
  if ((OpenCLEnum *)local_80._0_8_ != pOVar1) {
    operator_delete((void *)local_80._0_8_);
  }
  pOVar5 = (OpenCLEnum *)local_80;
  local_80._0_8_ = pOVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)pOVar5,"CL_DEVICE_VERSION","");
  queryDeviceInfo(pOVar5,device_id,0x102f,&device->version,(string *)local_80,0x400);
  if ((OpenCLEnum *)local_80._0_8_ != pOVar1) {
    operator_delete((void *)local_80._0_8_);
  }
  local_80._0_8_ = pOVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_80,"CL_DEVICE_MAX_COMPUTE_UNITS","");
  queryDeviceInfo<unsigned_int>(this,device_id,0x1002,&device->compute_units,(string *)local_80);
  if ((OpenCLEnum *)local_80._0_8_ != pOVar1) {
    operator_delete((void *)local_80._0_8_);
  }
  local_80._0_8_ = pOVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"CL_DEVICE_GLOBAL_MEM_SIZE","")
  ;
  queryDeviceInfo<unsigned_long_long>(this,device_id,0x101f,&device->mem_size,(string *)local_80);
  if ((OpenCLEnum *)local_80._0_8_ != pOVar1) {
    operator_delete((void *)local_80._0_8_);
  }
  local_80._0_8_ = pOVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_80,"CL_DEVICE_MAX_CLOCK_FREQUENCY","");
  queryDeviceInfo<unsigned_int>(this,device_id,0x100c,&device->clock,(string *)local_80);
  pOVar5 = (OpenCLEnum *)local_80._0_8_;
  if ((OpenCLEnum *)local_80._0_8_ != pOVar1) {
    operator_delete((void *)local_80._0_8_);
  }
  pPVar2 = (pointer)(local_80 + 8);
  local_80._8_4_ = _S_red;
  local_70._0_8_ = 0;
  local_70._24_8_ = (pointer)0x0;
  local_70._8_8_ = pPVar2;
  local_70._16_8_ = pPVar2;
  queryExtensionList(pOVar5,device_id,
                     (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_80);
  paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)((long)&local_50 + 0x10);
  local_50._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(local_70 + 0x20),"cl_nv_device_attribute_query","");
  cVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_80,(key_type *)(local_70 + 0x20));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar3) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((pointer)cVar4._M_node != pPVar2) {
    local_50._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)(local_70 + 0x20),"CL_DEVICE_PCI_BUS_ID_NV","");
    queryDeviceInfo<unsigned_int>
              (this,device_id,0x4008,&device->nvidia_pci_bus_id,(string *)(local_70 + 0x20));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar3) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    local_50._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)(local_70 + 0x20),"CL_DEVICE_PCI_SLOT_ID_NV","");
    queryDeviceInfo<unsigned_int>
              (this,device_id,0x4009,&device->nvidia_pci_slot_id,(string *)(local_70 + 0x20));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar3) {
      operator_delete(local_50._M_dataplus._M_p);
    }
  }
  local_50._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_70 + 0x20),"cl_khr_spir","");
  cVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_80,(key_type *)(local_70 + 0x20));
  device->has_cl_khr_spir = (pointer)cVar4._M_node != pPVar2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar3) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_80);
  return true;
}

Assistant:

bool OpenCLEnum::queryDeviceInfo(Device &device)
{
	cl_device_id device_id = device.id;

	queryDeviceInfo(device_id, CL_DEVICE_TYPE,					device.device_type,		"CL_DEVICE_TYPE");
	queryDeviceInfo(device_id, CL_DEVICE_NAME,					device.name,			"CL_DEVICE_NAME", 1024);
	queryDeviceInfo(device_id, CL_DEVICE_VENDOR,				device.vendor,			"CL_DEVICE_VENDOR", 1024);
	queryDeviceInfo(device_id, CL_DEVICE_VENDOR_ID,				device.vendor_id,		"CL_DEVICE_VENDOR_ID");
	queryDeviceInfo(device_id, CL_DEVICE_VERSION,				device.version,			"CL_DEVICE_VERSION", 1024);
	queryDeviceInfo(device_id, CL_DEVICE_MAX_COMPUTE_UNITS,		device.compute_units,	"CL_DEVICE_MAX_COMPUTE_UNITS");
	queryDeviceInfo(device_id, CL_DEVICE_GLOBAL_MEM_SIZE,		device.mem_size,		"CL_DEVICE_GLOBAL_MEM_SIZE");
	queryDeviceInfo(device_id, CL_DEVICE_MAX_CLOCK_FREQUENCY,	device.clock,			"CL_DEVICE_MAX_CLOCK_FREQUENCY");

	std::set< std::string > extensions;
	queryExtensionList(device_id, extensions);

	if (extensions.count("cl_nv_device_attribute_query")) {
		queryDeviceInfo(device_id, CL_DEVICE_PCI_BUS_ID_NV,		device.nvidia_pci_bus_id,	"CL_DEVICE_PCI_BUS_ID_NV");
		queryDeviceInfo(device_id, CL_DEVICE_PCI_SLOT_ID_NV,	device.nvidia_pci_slot_id,	"CL_DEVICE_PCI_SLOT_ID_NV");
	}

	device.has_cl_khr_spir = (extensions.count("cl_khr_spir") != 0);

	return true;
}